

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setFilterOperator
          (CommonCore *this,InterfaceHandle filter,shared_ptr<helics::FilterOperator> *callback)

{
  atomic<unsigned_short> *paVar1;
  uint16_t exp;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  pair<helics::route_id,_helics::ActionMessage> *ppVar5;
  InvalidIdentifier *this_00;
  char *pcVar6;
  size_t sVar7;
  ushort uVar8;
  bool bVar9;
  string_view message;
  ActionMessage filtOpUpdate;
  ActionMessage local_e0;
  
  if ((setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)::nullFilt
       == '\0') &&
     (iVar4 = __cxa_guard_acquire(&setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)
                                   ::nullFilt), iVar4 != 0)) {
    setFilterOperator::nullFilt.
    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (setFilterOperator::nullFilt.
     super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (setFilterOperator::nullFilt.
     super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (setFilterOperator::nullFilt.
     super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004ea7b8;
    setFilterOperator::nullFilt.
    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (setFilterOperator::nullFilt.
          super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
         1);
    setFilterOperator::nullFilt.
    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR__FilterOperator_004ea808;
    __cxa_atexit(std::__shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&setFilterOperator::nullFilt,&__dso_handle);
    __cxa_guard_release(&setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)
                         ::nullFilt);
  }
  ppVar5 = getHandleInfo(this,filter);
  if (ppVar5 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "filter is not a valid handle";
    sVar7 = 0x1c;
  }
  else {
    if ((char)(ppVar5->second).messageID == 'f') {
      ActionMessage::ActionMessage(&local_e0,cmd_core_configure);
      local_e0.messageID = 0x23c;
      if ((callback->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          == (element_type *)0x0) {
        (callback->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             setFilterOperator::nullFilt.
             super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(callback->
                    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   &setFilterOperator::nullFilt.
                    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      LOCK();
      paVar1 = &this->nextAirLock;
      uVar8 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
      (paVar1->super___atomic_base<unsigned_short>)._M_i =
           (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
      UNLOCK();
      uVar8 = uVar8 & 3;
      if (uVar8 == 3) {
        uVar2 = 4;
        do {
          LOCK();
          uVar3 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
          bVar9 = uVar2 == uVar3;
          if (bVar9) {
            (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = uVar2 & 3;
            uVar3 = uVar2;
          }
          UNLOCK();
        } while ((!bVar9) && (uVar2 = uVar3, 3 < uVar3));
      }
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::shared_ptr<helics::FilterOperator>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar8),callback);
      local_e0.source_id.gid = (ppVar5->first).rid;
      local_e0.source_handle.hid = filter.hid;
      local_e0.counter = uVar8;
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &(this->super_BrokerBase).actionQueue,&local_e0);
      ActionMessage::~ActionMessage(&local_e0);
      return;
    }
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "filter identifier does not point a filter";
    sVar7 = 0x29;
  }
  message._M_str = pcVar6;
  message._M_len = sVar7;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setFilterOperator(InterfaceHandle filter, std::shared_ptr<FilterOperator> callback)
{
    static const std::shared_ptr<FilterOperator> nullFilt = std::make_shared<NullFilterOperator>();
    const auto* hndl = getHandleInfo(filter);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("filter is not a valid handle"));
    }
    if ((hndl->handleType != InterfaceType::FILTER)) {
        throw(InvalidIdentifier("filter identifier does not point a filter"));
    }
    ActionMessage filtOpUpdate(CMD_CORE_CONFIGURE);
    filtOpUpdate.messageID = UPDATE_FILTER_OPERATOR;
    if (!callback) {
        callback = nullFilt;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callback));
    filtOpUpdate.counter = index;
    filtOpUpdate.source_id = hndl->getFederateId();
    filtOpUpdate.source_handle = filter;
    actionQueue.push(filtOpUpdate);
}